

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O0

void __thiscall cfd::core::Txid::Txid(Txid *this,string *hex)

{
  size_type sVar1;
  undefined8 uVar2;
  ByteData *in_stack_fffffffffffffee8;
  ByteData *in_stack_fffffffffffffef0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef8;
  allocator *paVar3;
  string *message;
  CfdError error_code;
  CfdException *this_00;
  allocator_type *in_stack_ffffffffffffff28;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  allocator in_stack_ffffffffffffff47;
  string local_b8 [32];
  size_type local_98;
  CfdSourceLocation local_90;
  undefined1 local_71 [17];
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  string *hex_local;
  Txid *this_local;
  
  this->_vptr_Txid = (_func_int **)&PTR__Txid_009ec968;
  data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)hex;
  hex_local = (string *)this;
  ByteData::ByteData(&this->data_);
  StringUtil::StringToByte(&local_38,(string *)data);
  local_20 = &local_38;
  message = (string *)(local_71 + 9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crbegin(in_stack_fffffffffffffef8);
  error_code = (CfdError)((ulong)(local_71 + 1) >> 0x20);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crend(in_stack_fffffffffffffef8);
  this_00 = (CfdException *)local_71;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x453b37);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x453b60);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  if (sVar1 != 0x20) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_coin.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x20;
    local_90.funcname = "Txid";
    local_98 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    logger::warn<unsigned_long>(&local_90,"Txid size Invalid. size={}.",&local_98);
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = (allocator *)&stack0xffffffffffffff47;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"Txid size Invalid.",paVar3);
    CfdException::CfdException(this_00,error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData((ByteData *)&stack0xffffffffffffff28,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  ByteData::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ByteData::~ByteData((ByteData *)0x453d0f);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return;
}

Assistant:

Txid::Txid(const std::string& hex) : data_() {
  const std::vector<uint8_t>& data = StringUtil::StringToByte(hex);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  if (reverse_buffer.size() != kByteData256Length) {
    warn(CFD_LOG_SOURCE, "Txid size Invalid. size={}.", reverse_buffer.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Txid size Invalid.");
  }
  data_ = ByteData(reverse_buffer);
}